

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void google::protobuf::internal::ExtensionSet::RegisterMessageExtension
               (MessageLite *containing_type,int number,FieldType type,bool is_repeated,
               bool is_packed,MessageLite *prototype)

{
  ExtensionInfo info;
  LogMessage *other;
  LogMessage local_90;
  FieldType local_58;
  undefined1 uStack_57;
  undefined1 uStack_56;
  undefined5 uStack_55;
  MessageLite *pMStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_38;
  LogFinisher local_31;
  
  if ((type & 0xfe) != 10) {
    local_38 = number;
    LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
               ,0xb1);
    other = LogMessage::operator<<
                      (&local_90,
                       "CHECK failed: type == WireFormatLite::TYPE_MESSAGE || type == WireFormatLite::TYPE_GROUP: "
                      );
    LogFinisher::operator=(&local_31,other);
    LogMessage::~LogMessage(&local_90);
    number = local_38;
  }
  uStack_40 = 0;
  info.is_repeated = is_repeated;
  info.type = type;
  info.is_packed = is_packed;
  info._3_5_ = uStack_55;
  info.field_3.enum_validity_check.func = (EnumValidityFuncWithArg *)prototype;
  info.field_3.enum_validity_check.arg = (void *)local_48;
  info.descriptor = (FieldDescriptor *)0x0;
  local_58 = type;
  uStack_57 = is_repeated;
  uStack_56 = is_packed;
  pMStack_50 = prototype;
  anon_unknown_22::Register(containing_type,number,info);
  return;
}

Assistant:

void ExtensionSet::RegisterMessageExtension(const MessageLite* containing_type,
                                            int number, FieldType type,
                                            bool is_repeated, bool is_packed,
                                            const MessageLite* prototype) {
  GOOGLE_CHECK(type == WireFormatLite::TYPE_MESSAGE ||
        type == WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(type, is_repeated, is_packed);
  info.message_info = {prototype};
  Register(containing_type, number, info);
}